

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_gcc.cc
# Opt level: O0

void ScaleARGBCols_SSE2(uint8_t *dst_argb,uint8_t *src_argb,int dst_width,int x,int dx)

{
  long lVar1;
  long lVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  undefined1 auVar11 [16];
  ulong uVar13;
  undefined1 auVar12 [16];
  intptr_t x1;
  intptr_t x0;
  int dx_local;
  int x_local;
  int dst_width_local;
  uint8_t *src_argb_local;
  uint8_t *dst_argb_local;
  
  auVar11._4_4_ = x + dx;
  auVar11._12_4_ = x + dx * 3;
  auVar11._0_4_ = x;
  auVar11._8_4_ = x + dx * 2;
  iVar6 = dx * 4;
  uVar13 = auVar11._8_8_;
  uVar7 = (ulong)(ushort)((uint)x >> 0x10);
  uVar8 = (ulong)(ushort)((uint)auVar11._4_4_ >> 0x10);
  if (-1 < dst_width) {
    uVar9 = dst_width - 4;
    uVar10 = uVar9;
    if (3 < dst_width) {
      do {
        lVar1 = uVar7 * 4;
        lVar2 = uVar8 * 4;
        auVar12._0_4_ = auVar11._0_4_ + iVar6;
        auVar12._4_4_ = auVar11._4_4_ + iVar6;
        auVar12._8_4_ = auVar11._8_4_ + iVar6;
        auVar12._12_4_ = auVar11._12_4_ + iVar6;
        uVar3 = *(undefined4 *)(src_argb + (ulong)auVar11._10_2_ * 4);
        uVar4 = *(undefined4 *)(src_argb + (ulong)auVar11._14_2_ * 4);
        uVar13 = auVar12._8_8_;
        uVar7 = (ulong)(ushort)((uint)auVar12._0_4_ >> 0x10);
        uVar8 = (ulong)(ushort)((uint)auVar12._4_4_ >> 0x10);
        *(ulong *)dst_argb =
             CONCAT44(*(undefined4 *)(src_argb + lVar2),*(undefined4 *)(src_argb + lVar1));
        *(ulong *)(dst_argb + 8) = CONCAT44(uVar4,uVar3);
        dst_argb = dst_argb + 0x10;
        uVar9 = uVar10 - 4;
        bVar5 = 3 < (int)uVar10;
        auVar11 = auVar12;
        uVar10 = uVar9;
      } while (bVar5);
    }
    if ((uVar9 & 2) != 0) {
      lVar1 = uVar7 * 4;
      uVar7 = uVar13 >> 0x10 & 0xffff;
      *(ulong *)dst_argb =
           CONCAT44(*(undefined4 *)(src_argb + uVar8 * 4),*(undefined4 *)(src_argb + lVar1));
      dst_argb = dst_argb + 8;
    }
    if ((uVar9 & 1) != 0) {
      *(undefined4 *)dst_argb = *(undefined4 *)(src_argb + uVar7 * 4);
    }
  }
  return;
}

Assistant:

void ScaleARGBCols_SSE2(uint8_t* dst_argb,
                        const uint8_t* src_argb,
                        int dst_width,
                        int x,
                        int dx) {
  intptr_t x0, x1;
  asm volatile(
      "movd        %5,%%xmm2                     \n"
      "movd        %6,%%xmm3                     \n"
      "pshufd      $0x0,%%xmm2,%%xmm2            \n"
      "pshufd      $0x11,%%xmm3,%%xmm0           \n"
      "paddd       %%xmm0,%%xmm2                 \n"
      "paddd       %%xmm3,%%xmm3                 \n"
      "pshufd      $0x5,%%xmm3,%%xmm0            \n"
      "paddd       %%xmm0,%%xmm2                 \n"
      "paddd       %%xmm3,%%xmm3                 \n"
      "pshufd      $0x0,%%xmm3,%%xmm3            \n"
      "pextrw      $0x1,%%xmm2,%k0               \n"
      "pextrw      $0x3,%%xmm2,%k1               \n"
      "cmp         $0x0,%4                       \n"
      "jl          99f                           \n"
      "sub         $0x4,%4                       \n"
      "jl          49f                           \n"

      LABELALIGN
      "40:                                       \n"
      "movd        0x00(%3,%0,4),%%xmm0          \n"
      "movd        0x00(%3,%1,4),%%xmm1          \n"
      "pextrw      $0x5,%%xmm2,%k0               \n"
      "pextrw      $0x7,%%xmm2,%k1               \n"
      "paddd       %%xmm3,%%xmm2                 \n"
      "punpckldq   %%xmm1,%%xmm0                 \n"
      "movd        0x00(%3,%0,4),%%xmm1          \n"
      "movd        0x00(%3,%1,4),%%xmm4          \n"
      "pextrw      $0x1,%%xmm2,%k0               \n"
      "pextrw      $0x3,%%xmm2,%k1               \n"
      "punpckldq   %%xmm4,%%xmm1                 \n"
      "punpcklqdq  %%xmm1,%%xmm0                 \n"
      "movdqu      %%xmm0,(%2)                   \n"
      "lea         0x10(%2),%2                   \n"
      "sub         $0x4,%4                       \n"
      "jge         40b                           \n"

      "49:                                       \n"
      "test        $0x2,%4                       \n"
      "je          29f                           \n"
      "movd        0x00(%3,%0,4),%%xmm0          \n"
      "movd        0x00(%3,%1,4),%%xmm1          \n"
      "pextrw      $0x5,%%xmm2,%k0               \n"
      "punpckldq   %%xmm1,%%xmm0                 \n"
      "movq        %%xmm0,(%2)                   \n"
      "lea         0x8(%2),%2                    \n"
      "29:                                       \n"
      "test        $0x1,%4                       \n"
      "je          99f                           \n"
      "movd        0x00(%3,%0,4),%%xmm0          \n"
      "movd        %%xmm0,(%2)                   \n"
      "99:                                       \n"
      : "=&a"(x0),       // %0
        "=&d"(x1),       // %1
        "+r"(dst_argb),  // %2
        "+r"(src_argb),  // %3
        "+r"(dst_width)  // %4
      : "rm"(x),         // %5
        "rm"(dx)         // %6
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4");
}